

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

void __thiscall Jinx::Impl::Parser::WriteDebugInfo(Parser *this)

{
  bool bVar1;
  size_type sVar2;
  reference val;
  DebugLineEntry *lineEntry;
  iterator __end2;
  iterator __begin2;
  vector<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
  *__range2;
  undefined4 local_18;
  DebugHeader opcodeHeader;
  Parser *this_local;
  
  opcodeHeader._4_8_ = this;
  DebugHeader::DebugHeader((DebugHeader *)((long)&__range2 + 4));
  sVar2 = std::
          vector<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
          ::size(&this->m_debugLines);
  local_18 = (undefined4)sVar2;
  sVar2 = std::
          vector<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
          ::size(&this->m_debugLines);
  opcodeHeader.signature = (int)sVar2 + 8;
  BinaryWriter::Write(&this->m_writer,(void *)((long)&__range2 + 4),0xc);
  __end2 = std::
           vector<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
           ::begin(&this->m_debugLines);
  lineEntry = (DebugLineEntry *)
              std::
              vector<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
              ::end(&this->m_debugLines);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<Jinx::Impl::DebugLineEntry_*,_std::vector<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>_>
                                *)&lineEntry);
    if (!bVar1) break;
    val = __gnu_cxx::
          __normal_iterator<Jinx::Impl::DebugLineEntry_*,_std::vector<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>_>
          ::operator*(&__end2);
    BinaryWriter::Write(&this->m_writer,val,8);
    __gnu_cxx::
    __normal_iterator<Jinx::Impl::DebugLineEntry_*,_std::vector<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

inline_t void Parser::WriteDebugInfo()
	{
		DebugHeader opcodeHeader;
		opcodeHeader.lineEntryCount = static_cast<uint32_t>(m_debugLines.size());
		opcodeHeader.dataSize = static_cast<uint32_t>(m_debugLines.size() + sizeof(DebugLineEntry));
		m_writer.Write(&opcodeHeader, sizeof(opcodeHeader));
		for (const auto & lineEntry : m_debugLines)
			m_writer.Write(&lineEntry, sizeof(lineEntry));
	}